

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.cpp
# Opt level: O3

void __thiscall
HEkk::updateDualDevexWeights(HEkk *this,HVector *column,double new_pivotal_edge_weight)

{
  double dVar1;
  uint dim;
  HighsInt count;
  pointer piVar2;
  pointer pdVar3;
  pointer pdVar4;
  bool bVar5;
  ulong uVar6;
  int iVar7;
  long lVar8;
  double dVar9;
  HighsInt to_entry;
  int local_34;
  
  HighsSimplexAnalysis::simplexTimerStart(&this->analysis_,0x4d,0);
  dim = (this->lp_).num_row_;
  count = column->count;
  piVar2 = (column->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar3 = (column->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar6 = (ulong)((long)(this->dual_edge_weight_).
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)(this->dual_edge_weight_).super__Vector_base<double,_std::allocator<double>_>
                       ._M_impl.super__Vector_impl_data._M_start) >> 3;
  if ((int)uVar6 < (int)dim) {
    printf("HEkk::updateDualDevexWeights solve %d: dual_edge_weight_.size() = %d < %d\n",
           (ulong)(uint)this->debug_solve_call_num_,uVar6,(ulong)dim);
    fflush(_stdout);
  }
  bVar5 = HSimplexNla::sparseLoopStyle(&this->simplex_nla_,count,dim,&local_34);
  if (0 < (long)local_34) {
    pdVar4 = (this->dual_edge_weight_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar8 = 0;
    do {
      if (bVar5) {
        iVar7 = piVar2[lVar8];
      }
      else {
        iVar7 = (int)lVar8;
      }
      dVar9 = pdVar3[iVar7];
      dVar9 = dVar9 * new_pivotal_edge_weight * dVar9;
      dVar1 = pdVar4[iVar7];
      if (dVar9 <= dVar1) {
        dVar9 = dVar1;
      }
      pdVar4[iVar7] = dVar9;
      lVar8 = lVar8 + 1;
    } while (local_34 != lVar8);
  }
  HighsSimplexAnalysis::simplexTimerStop(&this->analysis_,0x4d,0);
  return;
}

Assistant:

void HEkk::updateDualDevexWeights(const HVector* column,
                                  const double new_pivotal_edge_weight) {
  analysis_.simplexTimerStart(DevexUpdateWeightClock);

  const HighsInt num_row = lp_.num_row_;
  const HighsInt column_count = column->count;
  const HighsInt* variable_index = column->index.data();
  const double* column_array = column->array.data();

  if ((HighsInt)dual_edge_weight_.size() < num_row) {
    printf(
        "HEkk::updateDualDevexWeights solve %d: "
        "dual_edge_weight_.size() = %d < %d\n",
        (int)debug_solve_call_num_, (int)dual_edge_weight_.size(),
        (int)num_row);
    fflush(stdout);
  }
  assert((HighsInt)dual_edge_weight_.size() >= num_row);
  HighsInt to_entry;
  const bool use_row_indices =
      simplex_nla_.sparseLoopStyle(column_count, num_row, to_entry);
  for (HighsInt iEntry = 0; iEntry < to_entry; iEntry++) {
    const HighsInt iRow = use_row_indices ? variable_index[iEntry] : iEntry;
    const double aa_iRow = column_array[iRow];
    dual_edge_weight_[iRow] = max(dual_edge_weight_[iRow],
                                  new_pivotal_edge_weight * aa_iRow * aa_iRow);
  }
  analysis_.simplexTimerStop(DevexUpdateWeightClock);
}